

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O0

void ModActorFlag(AActor *actor,FFlagDef *fd,bool set)

{
  uint *puVar1;
  DWORD *flagvar;
  bool set_local;
  FFlagDef *fd_local;
  AActor *actor_local;
  
  puVar1 = (uint *)((long)&(actor->super_DThinker).super_DObject._vptr_DObject +
                   (long)fd->structoffset);
  if (set) {
    *puVar1 = fd->flagbit | *puVar1;
  }
  else {
    *puVar1 = (fd->flagbit ^ 0xffffffff) & *puVar1;
  }
  return;
}

Assistant:

void ModActorFlag(AActor *actor, FFlagDef *fd, bool set)
{
	// Little-Endian machines only need one case, because all field sizes
	// start at the same address. (Unless the machine has unaligned access
	// exceptions, in which case you'll need multiple cases for it too.)
#ifdef __BIG_ENDIAN__
	if (fd->fieldsize == 4)
#endif
	{
		DWORD *flagvar = (DWORD *)((char *)actor + fd->structoffset);
		if (set)
		{
			*flagvar |= fd->flagbit;
		}
		else
		{
			*flagvar &= ~fd->flagbit;
		}
	}
#ifdef __BIG_ENDIAN__
	else if (fd->fieldsize == 2)
	{
		WORD *flagvar = (WORD *)((char *)actor + fd->structoffset);
		if (set)
		{
			*flagvar |= fd->flagbit;
		}
		else
		{
			*flagvar &= ~fd->flagbit;
		}
	}
	else
	{
		assert(fd->fieldsize == 1);
		BYTE *flagvar = (BYTE *)((char *)actor + fd->structoffset);
		if (set)
		{
			*flagvar |= fd->flagbit;
		}
		else
		{
			*flagvar &= ~fd->flagbit;
		}
	}
#endif
}